

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::BackgroundCompaction(DBImpl *this)

{
  uint uVar1;
  long lVar2;
  uint *puVar3;
  long lVar4;
  undefined1 uVar5;
  int iVar6;
  int iVar7;
  VersionSet *pVVar8;
  VersionEdit *edit;
  char *pcVar9;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar10;
  bool bVar11;
  ManualCompaction *m_1;
  CompactionState *compact;
  FileMetaData *f;
  ManualCompaction *m;
  bool is_manual;
  Compaction *c;
  Status status;
  LevelSummaryStorage tmp;
  InternalKey manual_end;
  Compaction *in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  undefined4 in_stack_fffffffffffffd38;
  memory_order in_stack_fffffffffffffd3c;
  atomic<bool> *in_stack_fffffffffffffd40;
  Logger *pLVar12;
  undefined4 in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  InternalKey *in_stack_fffffffffffffd50;
  DBImpl *in_stack_fffffffffffffd58;
  uint64_t in_stack_fffffffffffffd60;
  CompactionState *compact_00;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  undefined8 in_stack_fffffffffffffd70;
  LevelSummaryStorage *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  uint in_stack_fffffffffffffd8c;
  InternalKey *in_stack_fffffffffffffd90;
  uint64_t uVar13;
  VersionSet *in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  pointer pcVar14;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde8;
  VersionSet *this_00;
  char *local_1f0;
  char *local_1e0;
  char *local_1d0;
  bool local_176;
  bool local_175;
  Compaction *local_158;
  pointer in_stack_fffffffffffffee0;
  DBImpl *in_stack_fffffffffffffee8;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffffd70 >> 0x20);
  iVar6 = (int)((ulong)in_stack_fffffffffffffda0 >> 0x20);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  port::Mutex::AssertHeld((Mutex *)in_stack_fffffffffffffd28);
  if (*(long *)(in_RDI + 0x138) == 0) {
    bVar10 = *(long *)(in_RDI + 0x220) != 0;
    InternalKey::InternalKey((InternalKey *)in_stack_fffffffffffffd28);
    if (bVar10) {
      puVar3 = *(uint **)(in_RDI + 0x220);
      local_158 = VersionSet::CompactRange
                            ((VersionSet *)
                             CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),iVar6,
                             (InternalKey *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      *(bool *)(puVar3 + 1) = local_158 == (Compaction *)0x0;
      if (local_158 != (Compaction *)0x0) {
        Compaction::num_input_files(in_stack_fffffffffffffd28,0);
        Compaction::input((Compaction *)
                          CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                          in_stack_fffffffffffffd34,in_stack_fffffffffffffd30);
        InternalKey::operator=
                  ((InternalKey *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                   (InternalKey *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      }
      pLVar12 = *(Logger **)(in_RDI + 0x48);
      uVar1 = *puVar3;
      lVar4 = *(long *)(puVar3 + 2);
      if (lVar4 == 0) {
        local_1d0 = "(begin)";
      }
      else {
        InternalKey::DebugString_abi_cxx11_
                  ((InternalKey *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
        local_1d0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd28);
      }
      local_175 = lVar4 != 0;
      lVar4 = *(long *)(puVar3 + 4);
      if (lVar4 == 0) {
        local_1e0 = "(end)";
      }
      else {
        InternalKey::DebugString_abi_cxx11_
                  ((InternalKey *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
        local_1e0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd28);
      }
      local_176 = lVar4 != 0;
      bVar11 = (puVar3[1] & 1) == 0;
      if (bVar11) {
        InternalKey::DebugString_abi_cxx11_
                  ((InternalKey *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
        local_1f0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd28);
      }
      else {
        local_1f0 = "(end)";
      }
      Log(pLVar12,"Manual compaction at level-%d from %s .. %s; will stop at %s\n",(ulong)uVar1,
          local_1d0,local_1e0,local_1f0);
      if (bVar11) {
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd28);
      }
      if (local_176) {
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd28);
      }
      if (local_175) {
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd28);
      }
    }
    else {
      local_158 = VersionSet::PickCompaction(in_stack_fffffffffffffd98);
    }
    Status::Status((Status *)in_stack_fffffffffffffd28);
    if (local_158 != (Compaction *)0x0) {
      if ((bVar10) ||
         (bVar11 = Compaction::IsTrivialMove
                             ((Compaction *)
                              CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)),
         !bVar11)) {
        operator_new(0x40);
        CompactionState::CompactionState
                  ((CompactionState *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                   (Compaction *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        DoCompactionWork(in_stack_fffffffffffffee8,(CompactionState *)in_stack_fffffffffffffee0);
        compact_00 = (CompactionState *)&stack0xfffffffffffffec8;
        Status::operator=((Status *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                          (Status *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        Status::~Status((Status *)in_stack_fffffffffffffd28);
        uVar5 = Status::ok((Status *)in_stack_fffffffffffffd28);
        if (!(bool)uVar5) {
          RecordBackgroundError
                    ((DBImpl *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                     (Status *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        }
        CleanupCompaction((DBImpl *)CONCAT17(uVar5,in_stack_fffffffffffffd68),compact_00);
        Compaction::ReleaseInputs(in_stack_fffffffffffffd28);
        DeleteObsoleteFiles((DBImpl *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8))
        ;
      }
      else {
        iVar6 = Compaction::num_input_files(in_stack_fffffffffffffd28,0);
        if (iVar6 != 1) {
          __assert_fail("c->num_input_files(0) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                        ,0x2da,"void leveldb::DBImpl::BackgroundCompaction()");
        }
        pVVar8 = (VersionSet *)
                 Compaction::input((Compaction *)
                                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                   in_stack_fffffffffffffd34,in_stack_fffffffffffffd30);
        this_00 = pVVar8;
        edit = Compaction::edit(in_stack_fffffffffffffd28);
        iVar6 = Compaction::level(in_stack_fffffffffffffd28);
        VersionEdit::DeleteFile
                  ((VersionEdit *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd4c,
                   (uint64_t)in_stack_fffffffffffffd40);
        Compaction::edit(in_stack_fffffffffffffd28);
        Compaction::level(in_stack_fffffffffffffd28);
        VersionEdit::AddFile
                  ((VersionEdit *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                   iVar7,in_stack_fffffffffffffd60,(uint64_t)in_stack_fffffffffffffd58,
                   in_stack_fffffffffffffd50,
                   (InternalKey *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        Compaction::edit(in_stack_fffffffffffffd28);
        VersionSet::LogAndApply(this_00,edit,(Mutex *)CONCAT44(iVar6,in_stack_fffffffffffffde8));
        Status::operator=((Status *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                          (Status *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        Status::~Status((Status *)in_stack_fffffffffffffd28);
        bVar11 = Status::ok((Status *)in_stack_fffffffffffffd28);
        if (!bVar11) {
          RecordBackgroundError
                    ((DBImpl *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                     (Status *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        }
        pLVar12 = *(Logger **)(in_RDI + 0x48);
        pcVar14 = (pVVar8->dbname_)._M_dataplus._M_p;
        iVar7 = Compaction::level(in_stack_fffffffffffffd28);
        in_stack_fffffffffffffd8c = iVar7 + 1;
        uVar13 = (pVVar8->dbname_)._M_string_length;
        Status::ToString_abi_cxx11_
                  ((Status *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
        pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd28);
        in_stack_fffffffffffffd28 =
             (Compaction *)
             VersionSet::LevelSummary
                       ((VersionSet *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                        in_stack_fffffffffffffd80);
        Log(pLVar12,"Moved #%lld to level-%d %lld bytes %s: %s\n",pcVar14,
            (ulong)in_stack_fffffffffffffd8c,uVar13,pcVar9);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd28);
      }
    }
    if (local_158 != (Compaction *)0x0) {
      Compaction::~Compaction
                ((Compaction *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      operator_delete(local_158,0x158);
    }
    bVar11 = Status::ok((Status *)in_stack_fffffffffffffd28);
    if ((!bVar11) &&
       (bVar11 = std::atomic<bool>::load(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c),
       !bVar11)) {
      pLVar12 = *(Logger **)(in_RDI + 0x48);
      Status::ToString_abi_cxx11_
                ((Status *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd28);
      Log(pLVar12,"Compaction error: %s",pcVar9);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd28);
    }
    if (bVar10) {
      lVar4 = *(long *)(in_RDI + 0x220);
      bVar10 = Status::ok((Status *)in_stack_fffffffffffffd28);
      if (!bVar10) {
        *(undefined1 *)(lVar4 + 4) = 1;
      }
      if ((*(byte *)(lVar4 + 4) & 1) == 0) {
        InternalKey::operator=
                  ((InternalKey *)
                   CONCAT44(CONCAT13(bVar10,(int3)in_stack_fffffffffffffd3c),
                            in_stack_fffffffffffffd38),
                   (InternalKey *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        *(long *)(lVar4 + 8) = lVar4 + 0x18;
      }
      *(undefined8 *)(in_RDI + 0x220) = 0;
    }
    Status::~Status((Status *)in_stack_fffffffffffffd28);
    InternalKey::~InternalKey((InternalKey *)in_stack_fffffffffffffd28);
  }
  else {
    CompactMemTable(in_stack_fffffffffffffd58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void DBImpl::BackgroundCompaction() {
  mutex_.AssertHeld();

  if (imm_ != nullptr) {
    CompactMemTable();
    return;
  }

  Compaction* c;
  bool is_manual = (manual_compaction_ != nullptr);
  InternalKey manual_end;
  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    c = versions_->CompactRange(m->level, m->begin, m->end);
    m->done = (c == nullptr);
    if (c != nullptr) {
      manual_end = c->input(0, c->num_input_files(0) - 1)->largest;
    }
    Log(options_.info_log,
        "Manual compaction at level-%d from %s .. %s; will stop at %s\n",
        m->level, (m->begin ? m->begin->DebugString().c_str() : "(begin)"),
        (m->end ? m->end->DebugString().c_str() : "(end)"),
        (m->done ? "(end)" : manual_end.DebugString().c_str()));
  } else {
    c = versions_->PickCompaction();
  }

  Status status;
  if (c == nullptr) {
    // Nothing to do
  } else if (!is_manual && c->IsTrivialMove()) {
    // Move file to next level
    assert(c->num_input_files(0) == 1);
    FileMetaData* f = c->input(0, 0);
    c->edit()->DeleteFile(c->level(), f->number);
    c->edit()->AddFile(c->level() + 1, f->number, f->file_size, f->smallest,
                       f->largest);
    status = versions_->LogAndApply(c->edit(), &mutex_);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    VersionSet::LevelSummaryStorage tmp;
    Log(options_.info_log, "Moved #%lld to level-%d %lld bytes %s: %s\n",
        static_cast<unsigned long long>(f->number), c->level() + 1,
        static_cast<unsigned long long>(f->file_size),
        status.ToString().c_str(), versions_->LevelSummary(&tmp));
  } else {
    CompactionState* compact = new CompactionState(c);
    status = DoCompactionWork(compact);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    CleanupCompaction(compact);
    c->ReleaseInputs();
    DeleteObsoleteFiles();
  }
  delete c;

  if (status.ok()) {
    // Done
  } else if (shutting_down_.load(std::memory_order_acquire)) {
    // Ignore compaction errors found during shutting down
  } else {
    Log(options_.info_log, "Compaction error: %s", status.ToString().c_str());
  }

  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    if (!status.ok()) {
      m->done = true;
    }
    if (!m->done) {
      // We only compacted part of the requested range.  Update *m
      // to the range that is left to be compacted.
      m->tmp_storage = manual_end;
      m->begin = &m->tmp_storage;
    }
    manual_compaction_ = nullptr;
  }
}